

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O0

void __thiscall btSoftBody::CJoint::Solve(CJoint *this,btScalar dt,btScalar sor)

{
  btScalar *pbVar1;
  Impulse *in_RDI;
  btScalar bVar2;
  btVector3 bVar3;
  btVector3 fv;
  btVector3 iv;
  Impulse impulse;
  btScalar rvac;
  btVector3 vrel;
  btVector3 vb;
  btVector3 va;
  btVector3 *in_stack_fffffffffffffe68;
  btVector3 *in_stack_fffffffffffffe70;
  Impulse *in_stack_fffffffffffffe78;
  Impulse *impulse_00;
  Impulse *in_stack_fffffffffffffe80;
  Body *this_00;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  btScalar local_b8 [2];
  btScalar local_b0 [6];
  btVector3 local_98;
  btScalar local_88 [4];
  btScalar local_78 [4];
  btVector3 local_68 [2];
  byte local_48;
  float local_44;
  btScalar local_40 [4];
  btScalar local_30 [4];
  btScalar local_20 [4];
  
  local_20 = (btScalar  [4])
             Body::velocity((Body *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                            (btVector3 *)
                            CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  local_30 = (btScalar  [4])
             Body::velocity((Body *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                            (btVector3 *)
                            CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  local_40 = (btScalar  [4])
             operator-(&in_stack_fffffffffffffe80->m_velocity,&in_stack_fffffffffffffe78->m_velocity
                      );
  local_44 = btDot(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  Impulse::Impulse(in_stack_fffffffffffffe80);
  local_48 = local_48 & 0xfe | 1;
  local_68[0].m_floats._0_8_ = *(undefined8 *)(in_RDI[2].m_drift.m_floats + 3);
  local_68[0].m_floats._8_8_ = *(undefined8 *)in_RDI[3].m_velocity.m_floats;
  if (local_44 < 0.0) {
    local_78 = (btScalar  [4])
               ::operator*(&in_stack_fffffffffffffe80->m_velocity,
                           (btScalar *)in_stack_fffffffffffffe78);
    local_88 = (btScalar  [4])
               operator-(&in_stack_fffffffffffffe80->m_velocity,
                         &in_stack_fffffffffffffe78->m_velocity);
    ::operator*(&in_stack_fffffffffffffe80->m_velocity,(btScalar *)in_stack_fffffffffffffe78);
    local_98 = operator+(&in_stack_fffffffffffffe80->m_velocity,
                         &in_stack_fffffffffffffe78->m_velocity);
    btVector3::operator+=(local_68,&local_98);
  }
  ::operator*((btMatrix3x3 *)in_stack_fffffffffffffe80,&in_stack_fffffffffffffe78->m_velocity);
  bVar3 = ::operator*(&in_stack_fffffffffffffe80->m_velocity,(btScalar *)in_stack_fffffffffffffe78);
  local_b8 = bVar3.m_floats._0_8_;
  local_68[0].m_floats[0] = local_b8[0];
  local_68[0].m_floats[1] = local_b8[1];
  local_b0._0_8_ = bVar3.m_floats._8_8_;
  local_68[0].m_floats[2] = local_b0[0];
  local_68[0].m_floats[3] = local_b0[1];
  if (*(long *)((in_RDI->m_velocity).m_floats + 2) == *(long *)&in_RDI->field_0x20) {
    pbVar1 = btVector3::getX(local_68);
    bVar2 = *pbVar1;
    pbVar1 = btVector3::getX(local_68);
    if ((bVar2 == *pbVar1) && (!NAN(bVar2) && !NAN(*pbVar1))) {
      pbVar1 = btVector3::getY(local_68);
      bVar2 = *pbVar1;
      pbVar1 = btVector3::getY(local_68);
      if ((bVar2 == *pbVar1) && (!NAN(bVar2) && !NAN(*pbVar1))) {
        pbVar1 = btVector3::getZ(local_68);
        bVar2 = *pbVar1;
        pbVar1 = btVector3::getZ(local_68);
        if ((((bVar2 == *pbVar1) && (!NAN(bVar2) && !NAN(*pbVar1))) &&
            ((char)(local_48 << 7) < '\0')) &&
           (bVar2 = btVector3::length((btVector3 *)0x27b0b6),
           *(float *)(*(long *)((in_RDI->m_velocity).m_floats + 2) + 0x198) <= bVar2)) {
          impulse_00 = (Impulse *)((in_RDI->m_velocity).m_floats + 2);
          Impulse::operator-(in_RDI);
          Impulse::operator*(in_stack_fffffffffffffe80,(btScalar)((ulong)impulse_00 >> 0x20));
          Body::applyImpulse((Body *)in_stack_fffffffffffffe80,impulse_00,in_stack_fffffffffffffe70)
          ;
          this_00 = (Body *)&in_RDI->field_0x20;
          Impulse::operator*((Impulse *)this_00,(btScalar)((ulong)impulse_00 >> 0x20));
          Body::applyImpulse(this_00,impulse_00,in_stack_fffffffffffffe70);
        }
      }
    }
  }
  else {
    pbVar1 = (in_RDI->m_velocity).m_floats + 2;
    Impulse::operator-(in_RDI);
    Body::applyImpulse((Body *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                       (btVector3 *)pbVar1);
    Body::applyImpulse((Body *)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,
                       (btVector3 *)pbVar1);
  }
  return;
}

Assistant:

void				btSoftBody::CJoint::Solve(btScalar dt,btScalar sor)
{
	const btVector3		va=m_bodies[0].velocity(m_rpos[0]);
	const btVector3		vb=m_bodies[1].velocity(m_rpos[1]);
	const btVector3		vrel=va-vb;
	const btScalar		rvac=btDot(vrel,m_normal);
	btSoftBody::Impulse	impulse;
	impulse.m_asVelocity	=	1;
	impulse.m_velocity		=	m_drift;
	if(rvac<0)
	{
		const btVector3	iv=m_normal*rvac;
		const btVector3	fv=vrel-iv;
		impulse.m_velocity	+=	iv+fv*m_friction;
	}
	impulse.m_velocity=m_massmatrix*impulse.m_velocity*sor;
	
	if (m_bodies[0].m_soft==m_bodies[1].m_soft)
	{
		if ((impulse.m_velocity.getX() ==impulse.m_velocity.getX())&&(impulse.m_velocity.getY() ==impulse.m_velocity.getY())&&
			(impulse.m_velocity.getZ() ==impulse.m_velocity.getZ()))
		{
			if (impulse.m_asVelocity)
			{
				if (impulse.m_velocity.length() <m_bodies[0].m_soft->m_maxSelfCollisionImpulse)
				{
					
				} else
				{
					m_bodies[0].applyImpulse(-impulse*m_bodies[0].m_soft->m_selfCollisionImpulseFactor,m_rpos[0]);
					m_bodies[1].applyImpulse( impulse*m_bodies[0].m_soft->m_selfCollisionImpulseFactor,m_rpos[1]);
				}
			}
		}
	} else
	{
		m_bodies[0].applyImpulse(-impulse,m_rpos[0]);
		m_bodies[1].applyImpulse( impulse,m_rpos[1]);
	}
}